

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab8-0.c
# Opt level: O3

int Check(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *__s;
  size_t __n;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint edgeIdx;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  TTestcaseData TVar13;
  TTestcaseData TVar14;
  uint b;
  uint a;
  char bufMsg [128];
  uint local_4e6c;
  uint local_4e68;
  int local_4e64;
  ulong local_4e60;
  undefined1 local_4e58 [16];
  undefined1 local_4e48 [16];
  undefined1 local_4e38 [16];
  undefined1 local_4e28 [16];
  undefined1 local_4e18 [16];
  undefined1 local_4e08 [16];
  undefined1 local_4df8 [16];
  undefined1 local_4de8 [16];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar3 = 0xffffffff;
    goto LAB_00101871;
  }
  TVar13 = GetFromTestcase(TestcaseIdx,ERROR_MESSAGE,0xffffffff);
  pcVar5 = TVar13.String;
  if (pcVar5 == (char *)0x0) {
    TVar13 = GetFromTestcase(TestcaseIdx,VERTEX_COUNT,0xffffffff);
    uVar4 = TVar13.Integer;
    if (TVar13.Edge.Begin != 0) {
      lVar7 = (uVar4 & 0xffffffff) - 1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar10 = auVar10 ^ _DAT_00103020;
      auVar11 = _DAT_00103010;
      do {
        auVar12 = auVar11 ^ _DAT_00103020;
        if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                    auVar10._4_4_ < auVar12._4_4_) & 1)) {
          *(int *)(local_4e58 + uVar8 * 4) = (int)uVar8;
        }
        if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
            auVar12._12_4_ <= auVar10._12_4_) {
          *(int *)(local_4e58 + uVar8 * 4 + 4) = (int)uVar8 + 1;
        }
        uVar8 = uVar8 + 2;
        lVar7 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar7 + 2;
      } while (((uVar4 & 0xffffffff) + 1 & 0xfffffffffffffffe) != uVar8);
      if (TVar13.Edge.Begin == 1) {
        uVar8 = 0;
      }
      else {
        iVar2 = 1;
        uVar8 = 0;
        local_4e60 = uVar4;
        do {
          pcVar5 = ScanUintUint((FILE *)__stream,&local_4e68,&local_4e6c);
          uVar6 = local_4e68;
          uVar3 = local_4e6c;
          if (pcVar5 != "PASSED") {
LAB_001017ba:
            __s = "FAILED";
            goto LAB_0010182a;
          }
          local_4e64 = iVar2;
          TVar13 = GetFromTestcase(TestcaseIdx,VERTEX_COUNT,0xffffffff);
          if (((uVar6 == 0) || (TVar13.Edge.Begin < uVar6)) || (TVar13.Edge.Begin <= uVar3 - 1)) {
LAB_001017a4:
            printf("wrong output -- ");
            goto LAB_001017ba;
          }
          TVar13 = GetFromTestcase(TestcaseIdx,EDGE_COUNT,0xffffffff);
          if (TVar13.Edge.Begin == 0) goto LAB_001017a4;
          edgeIdx = 0;
          while( true ) {
            TVar14 = GetFromTestcase(TestcaseIdx,EDGE,edgeIdx);
            if ((uVar3 == TVar14.Edge.End && uVar6 == TVar14.Edge.Begin) ||
               (TVar14.Edge.End == uVar6 && uVar3 == TVar14.Edge.Begin)) break;
            edgeIdx = edgeIdx + 1;
            if (TVar13.Edge.Begin == edgeIdx) goto LAB_001017a4;
          }
          uVar3 = local_4e68 - 1;
          do {
            uVar6 = uVar3;
            uVar3 = *(uint *)(local_4e58 + (ulong)uVar6 * 4);
          } while (uVar6 != *(uint *)(local_4e58 + (ulong)uVar6 * 4));
          uVar3 = local_4e6c - 1;
          do {
            uVar1 = uVar3;
            uVar3 = *(uint *)(local_4e58 + (ulong)uVar1 * 4);
          } while (uVar1 != *(uint *)(local_4e58 + (ulong)uVar1 * 4));
          if (uVar6 == uVar1) goto LAB_001017a4;
          *(uint *)(local_4e58 + (ulong)uVar6 * 4) = uVar1;
          TVar13 = GetFromTestcase(TestcaseIdx,EDGE,edgeIdx);
          uVar8 = uVar8 + TVar13.Edge.Length;
          iVar2 = local_4e64 + 1;
          uVar4 = local_4e60;
        } while (iVar2 != (int)local_4e60);
      }
      uVar9 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + (uint)(uVar9 == *(uint *)(local_4e58 + uVar9 * 4));
        uVar9 = uVar9 + 1;
      } while ((uVar4 & 0xffffffff) != uVar9);
      if ((iVar2 == 1) &&
         (TVar13 = GetFromTestcase(TestcaseIdx,MST_LENGTH,0xffffffff), uVar8 <= TVar13.Integer))
      goto LAB_00101823;
    }
LAB_0010180c:
    printf("wrong output -- ");
    __s = "FAILED";
  }
  else {
    local_4de8 = (undefined1  [16])0x0;
    local_4df8 = (undefined1  [16])0x0;
    local_4e08 = (undefined1  [16])0x0;
    local_4e18 = (undefined1  [16])0x0;
    local_4e28 = (undefined1  [16])0x0;
    local_4e38 = (undefined1  [16])0x0;
    local_4e48 = (undefined1  [16])0x0;
    local_4e58 = (undefined1  [16])0x0;
    __s = ScanChars((FILE *)__stream,0x80,local_4e58);
    if (__s == "PASSED") {
      __n = strlen(pcVar5);
      iVar2 = strncasecmp(pcVar5,local_4e58,__n);
      if (iVar2 != 0) goto LAB_0010180c;
LAB_00101823:
      __s = "PASSED";
    }
  }
LAB_0010182a:
  if (__s == "PASSED") {
    iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
    if (iVar2 == 0) {
      __s = "PASSED";
    }
    else {
      __s = "FAILED";
    }
  }
  fclose(__stream);
  puts(__s);
  uVar3 = (uint)(__s == "FAILED");
LAB_00101871:
  TestcaseIdx = TestcaseIdx + 1;
  return uVar3;
}

Assistant:

static int Check(void) {
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        ++TestcaseIdx;
        return -1;
    }
    const char* status = Pass;
    const char* message = GetFromTestcase(TestcaseIdx, ERROR_MESSAGE, IGNORED_EDGE_IDX).String;
    if (message != NULL) { // test error message
        char bufMsg[128] = {0};
        status = ScanChars(out, sizeof(bufMsg), bufMsg);
        if (status == Pass && _strnicmp(message, bufMsg, strlen(message)) != 0) {
            printf("wrong output -- ");
            status = Fail;
        }
    } else { // test spanning tree
        const unsigned vertexCount = GetVertexCount();
        unsigned vertexParent[MAX_VERTEX_COUNT];
        unsigned long long length = 0;
        InitParent(vertexCount, vertexParent);
        for (unsigned idx = 0; idx + 1 < vertexCount; ++idx) {
            unsigned a, b;
            if (ScanUintUint(out, &a, &b) != Pass) {
                status = Fail;
                break;
            }
            const unsigned edgeIdx = FindEdge(a, b);
            if (edgeIdx == IGNORED_EDGE_IDX) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            const unsigned rootA = FindRoot(a - 1, vertexParent);
            const unsigned rootB = FindRoot(b - 1, vertexParent);
            if (rootA == rootB) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            vertexParent[rootA] = rootB;
            length += GetFromTestcase(TestcaseIdx, EDGE, edgeIdx).Edge.Length;
        }
        if (status == Pass) {
            if (CountRoots(vertexCount, vertexParent) != 1 || length > GetFromTestcase(TestcaseIdx, MST_LENGTH, IGNORED_EDGE_IDX).Integer) {
                printf("wrong output -- ");
                status = Fail;
            }
        }
    }
    if (status == Pass && HaveGarbageAtTheEnd(out)) {
        status = Fail;
    }
    fclose(out);
    printf("%s\n", status);
    ++TestcaseIdx;
    return status == Fail;
}